

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator l;
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffe18;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe20;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int line;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe60;
  value_type *in_stack_fffffffffffffe98;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  pointer in_stack_fffffffffffffed8;
  char *local_118;
  char *local_110;
  char *local_108;
  AssertHelper *local_d8;
  unsigned_long *local_d0;
  AssertionResult local_80;
  int local_6c;
  size_type local_68;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_14 = 10; local_14 < 2000; local_14 = local_14 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xeca2b8);
  }
  local_68 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xeca2ff);
  for (local_6c = 10; type = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20), local_6c < 1000;
      local_6c = local_6c + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,(uint *)in_stack_fffffffffffffe28
               ,(unsigned_long *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe60 =
           (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xeca3cc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,(Type)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (char *)in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 in_stack_fffffffffffffe30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffea0,(Message *)in_stack_fffffffffffffe98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0xeca429);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xeca494);
  }
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffe60);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe60);
  l.pos._0_4_ = in_stack_fffffffffffffed0;
  l.ht = (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffec8;
  l.pos._4_4_ = in_stack_fffffffffffffed4;
  l.end = in_stack_fffffffffffffed8;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffea0,in_stack_fffffffffffffeb0,l);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xeca5ba);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_110,local_118,(uint *)local_d0,(unsigned_long *)local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffed8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe50 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xeca621);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,local_108,(int)((ulong)local_110 >> 0x20),local_118);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffea0,(Message *)in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message((Message *)0xeca67e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeca6ec);
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xeca6fa);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (local_110,local_118,local_d0,(unsigned_long *)local_d8);
  line = (int)((ulong)local_110 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffea8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xeca773);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,(Type)((ulong)pcVar2 >> 0x20),local_108,line,local_118);
    testing::internal::AssertHelper::operator=(this_00,(Message *)in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message((Message *)0xeca7c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeca82f);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}